

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O3

node_type * __thiscall
st_tree::detail::
node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
::_copy_data(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
             *this,tree_type *tree_)

{
  new_allocator<st_tree::detail::node_ordered<st_tree::tree<ut_ordered::emplace_subnodes::test_method()::str1,st_tree::ordered<st_tree::arg_default>,std::allocator<ut_ordered::emplace_subnodes::test_method()::str1>>,ut_ordered::emplace_subnodes::test_method()::str1,std::less<ut_ordered::emplace_subnodes::test_method()::str1>>>
  *this_00;
  _Base_ptr p_Var1;
  node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
  *__args;
  _Rb_tree_header *p_Var2;
  tree_type *tree__00;
  node_type *c;
  node_type *local_30;
  
  this_00 = (new_allocator<st_tree::detail::node_ordered<st_tree::tree<ut_ordered::emplace_subnodes::test_method()::str1,st_tree::ordered<st_tree::arg_default>,std::allocator<ut_ordered::emplace_subnodes::test_method()::str1>>,ut_ordered::emplace_subnodes::test_method()::str1,std::less<ut_ordered::emplace_subnodes::test_method()::str1>>>
             *)operator_new(0xa8);
  __gnu_cxx::
  new_allocator<st_tree::detail::node_ordered<st_tree::tree<ut_ordered::emplace_subnodes::test_method()::str1,st_tree::ordered<st_tree::arg_default>,std::allocator<ut_ordered::emplace_subnodes::test_method()::str1>>,ut_ordered::emplace_subnodes::test_method()::str1,std::less<ut_ordered::emplace_subnodes::test_method()::str1>>>
  ::
  construct<st_tree::detail::node_ordered<st_tree::tree<ut_ordered::emplace_subnodes::test_method()::str1,st_tree::ordered<st_tree::arg_default>,std::allocator<ut_ordered::emplace_subnodes::test_method()::str1>>,ut_ordered::emplace_subnodes::test_method()::str1,std::less<ut_ordered::emplace_subnodes::test_method()::str1>>,st_tree::detail::node_ordered<st_tree::tree<ut_ordered::emplace_subnodes::test_method()::str1,st_tree::ordered<st_tree::arg_default>,std::allocator<ut_ordered::emplace_subnodes::test_method()::str1>>,ut_ordered::emplace_subnodes::test_method()::str1,std::less<ut_ordered::emplace_subnodes::test_method()::str1>>const&>
            (this_00,(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
                      *)tree_,__args);
  *(int *)(this_00 + 0x20) =
       (this->
       super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
       )._data.i1;
  tree__00 = (tree_type *)
             &(this->
              super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
              )._data.s1;
  std::__cxx11::string::_M_assign((string *)(this_00 + 0x28));
  if (this_00 !=
      (new_allocator<st_tree::detail::node_ordered<st_tree::tree<ut_ordered::emplace_subnodes::test_method()::str1,st_tree::ordered<st_tree::arg_default>,std::allocator<ut_ordered::emplace_subnodes::test_method()::str1>>,ut_ordered::emplace_subnodes::test_method()::str1,std::less<ut_ordered::emplace_subnodes::test_method()::str1>>>
       *)this) {
    *(unsigned_long *)(this_00 + 0xa0) =
         (this->
         super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
         )._depth._max;
    tree__00 = (tree_type *)
               &(this->
                super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                )._depth._hist;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this_00 + 0x88),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)tree__00);
  }
  p_Var1 = (this->
           super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
           )._children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->
            super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
            )._children._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_30 = _copy_data(*(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
                              **)(p_Var1 + 1),tree__00);
      tree__00 = (tree_type *)&local_30;
      std::
      multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
      ::insert((multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                *)(this_00 + 0x48),(value_type *)&local_30);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return (node_type *)this_00;
}

Assistant:

node_type* _copy_data(tree_type& tree_) const {
        node_type* n = tree_._new_node();
        n->_data = this->_data;
        n->_depth = this->_depth;
        for (cs_const_iterator j(this->_children.begin());  j != this->_children.end();  ++j) {
            node_type* c((*j)->_copy_data(tree_));
            n->_children.insert(c);
        }
        return n;
    }